

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument.cpp
# Opt level: O2

void __thiscall QTextHtmlExporter::emitFontFamily(QTextHtmlExporter *this,QStringList *families)

{
  bool bVar1;
  QString *family;
  QString *this_00;
  long lVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QString::append((QLatin1String *)this);
  this_00 = (families->d).ptr;
  bVar1 = true;
  for (lVar2 = (families->d).size * 0x18; lVar2 != 0; lVar2 = lVar2 + -0x18) {
    QString::contains(this_00,(QChar)0x27,CaseSensitive);
    if (!bVar1) {
      QString::append((QLatin1String *)this);
    }
    QString::append((QLatin1String *)this);
    QString::toHtmlEscaped();
    QString::append((QString *)this);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    QString::append((QLatin1String *)this);
    this_00 = this_00 + 1;
    bVar1 = false;
  }
  QString::append((QChar)(char16_t)this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextHtmlExporter::emitFontFamily(const QStringList &families)
{
    html += " font-family:"_L1;

    bool first = true;
    for (const QString &family : families) {
        auto quote = "\'"_L1;
        if (family.contains(u'\''))
            quote = "&quot;"_L1;

        if (!first)
            html += ","_L1;
        else
            first = false;
        html += quote;
        html += family.toHtmlEscaped();
        html += quote;
    }
    html += u';';
}